

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int16_t bf_peek_int16_be(bfile_t *bfile)

{
  int iVar1;
  long in_RDI;
  int8_t *buffer;
  int bufoff;
  int16_t value;
  int16_t local_2;
  
  iVar1 = (int)(*(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38));
  if ((iVar1 == 0) && (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x20))) {
    bf_read_buffer(_bufoff);
  }
  if (*(long *)(in_RDI + 0x20) - 2U < *(ulong *)(in_RDI + 0x18)) {
    fprintf(_stderr,"bfile warning: could not peek on next int16.\n");
    local_2 = 0;
  }
  else {
    local_2 = CONCAT11(*(undefined1 *)(*(long *)(in_RDI + 0x30) + (long)iVar1),
                       *(undefined1 *)
                        (*(long *)(in_RDI + 0x30) +
                        (long)(int)((iVar1 + 1U) % *(uint *)(in_RDI + 0x38))));
  }
  return local_2;
}

Assistant:

int16_t
bf_peek_int16_be(
    bfile_t * bfile )
{
    int16_t value;
    int bufoff;
    int8_t * buffer;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next int16.\n" );
        return 0;
    }

    buffer = (int8_t *) bfile->buffer;
    value = buffer[bufoff] << 8;
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | bfile->buffer[bufoff];

    return value;
}